

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cpp
# Opt level: O3

string * sqlcheck::WrapText(string *__return_storage_ptr__,string *text)

{
  string *psVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  ulong uVar5;
  bool bVar6;
  string word;
  ostringstream wrapped;
  istringstream words;
  char local_351;
  char *local_350;
  ulong local_348;
  char local_340 [16];
  string *local_330;
  ostringstream local_328 [112];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)text,_S_in);
  std::__cxx11::ostringstream::ostringstream(local_328);
  local_350 = local_340;
  local_348 = 0;
  local_340[0] = '\0';
  piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_350);
  local_330 = __return_storage_ptr__;
  if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,local_350,local_348);
    uVar5 = 0x50 - local_348;
    bVar6 = false;
    while( true ) {
      piVar3 = std::operator>>((istream *)local_1b0,(string *)&local_350);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      iVar2 = std::__cxx11::string::compare((char *)&local_350);
      if (iVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"\n\n",2);
        poVar4 = (ostream *)local_328;
        if ((bool)(bVar6 | uVar5 < local_348 + 1)) goto LAB_0011b781;
LAB_0011b7b9:
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_350,local_348);
        uVar5 = uVar5 + ~local_348;
      }
      else {
        if ((bool)(~bVar6 & local_348 + 1 <= uVar5)) {
          local_351 = ' ';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_328,&local_351,1);
          goto LAB_0011b7b9;
        }
LAB_0011b781:
        local_351 = '\n';
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_328,&local_351,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_350,local_348);
        uVar5 = 0x50 - local_348;
      }
      bVar6 = local_350[local_348 - 1] == ':';
    }
  }
  psVar1 = local_330;
  std::__cxx11::stringbuf::str();
  if (local_350 != local_340) {
    operator_delete(local_350);
  }
  std::__cxx11::ostringstream::~ostringstream(local_328);
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string WrapText(const std::string& text){

  size_t line_length = 80;

  std::istringstream words(text);
  std::ostringstream wrapped;
  std::string word;
  bool newline = false;
  bool newpara = false;

  if (words >> word) {

    wrapped << word;

    size_t space_left = line_length - word.length();
    while (words >> word) {
      if(word == "●"){
        wrapped << "\n\n";
        newpara = true;
      }
      else{
        newpara = false;
      }

      if (space_left < word.length() + 1 || newline) {
        wrapped << '\n' << word;
        space_left = line_length - word.length();
      }
      else {
        if(newpara == false){
          wrapped << ' ' << word;
        }
        else{
          wrapped << word;
        }
        space_left -= word.length() + 1;
      }

      if(word.back() == ':'){
        newline = true;
      }
      else{
        newline = false;
      }
    }

  }

  return wrapped.str();
}